

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O1

bool __thiscall
gl4cts::EnhancedLayouts::XFBOverrideQualifiersWithAPITest::inspectProgram
          (XFBOverrideQualifiersWithAPITest *this,GLuint test_case_index,Program *program,
          stringstream *out_stream)

{
  int iVar1;
  int iVar2;
  uint in_EAX;
  GLuint GVar3;
  ostream *poVar4;
  Type TVar5;
  GLint stride;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  TVar5 = TestBase::getType((TestBase *)this,test_case_index);
  GVar3 = Utils::Type::GetTypeSize(TVar5.m_basic_type);
  Utils::Program::GetResource(program,0x8c8e,0,0x934c,1,(GLint *)((long)&uStack_38 + 4));
  iVar1 = GVar3 * TVar5.m_n_rows * TVar5.m_n_columns * 3;
  iVar2 = uStack_38._4_4_;
  if (iVar1 != uStack_38._4_4_) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(out_stream + 0x10),"Stride is: ",0xb);
    poVar4 = (ostream *)std::ostream::operator<<(out_stream + 0x10,uStack_38._4_4_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," expected: ",0xb);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  }
  return iVar1 == iVar2;
}

Assistant:

bool XFBOverrideQualifiersWithAPITest::inspectProgram(GLuint test_case_index, Utils::Program& program,
													  std::stringstream& out_stream)
{
	GLint			   stride	= 0;
	const Utils::Type& type		 = getType(test_case_index);
	const GLuint	   type_size = type.GetSize();

	program.GetResource(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, GL_TRANSFORM_FEEDBACK_BUFFER_STRIDE,
						1 /* buf_size */, &stride);

	if ((GLint)(3 * type_size) != stride)
	{
		out_stream << "Stride is: " << stride << " expected: " << (3 * type_size);

		return false;
	}

	return true;
}